

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O2

void __thiscall QCacheItem::writeCompressedData(QCacheItem *this,QFileDevice *device)

{
  QByteArray *data;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_38,(QIODevice *)device);
  data = (QByteArray *)QBuffer::data();
  qCompress((QByteArray *)&local_50,data,-1);
  ::operator<<((QDataStream *)&local_38,(QByteArray *)&local_50);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  QDataStream::~QDataStream((QDataStream *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCacheItem::writeCompressedData(QFileDevice *device) const
{
    QDataStream out(device);

    out << qCompress(data.data());
}